

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

uint __thiscall NALUnit::extractUEGolombCode(NALUnit *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  uint num;
  
  num = 0xffffffff;
  do {
    bVar1 = BitStreamReader::getBit(&this->bitReader);
    num = num + 1;
  } while (!bVar1);
  if (num < 0x21) {
    uVar2 = BitStreamReader::getBits(&this->bitReader,num);
    return uVar2 + ~(-1 << ((byte)num & 0x1f));
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00249978;
  __cxa_throw(puVar3,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

unsigned NALUnit::extractUEGolombCode()
{
    unsigned cnt = 0;
    for (; bitReader.getBit() == 0; cnt++)
        ;
    if (cnt > INT_BIT)
        THROW_BITSTREAM_ERR;
    return (1 << cnt) - 1 + bitReader.getBits(cnt);
}